

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCodeMetadata
          (BinaryReaderIR *this,Offset offset,void *data,Address size)

{
  pointer pCVar1;
  unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> local_60;
  undefined1 local_58 [8];
  __single_object meta;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_;
  Address size_local;
  void *data_local;
  Offset offset_local;
  BinaryReaderIR *this_local;
  
  data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)size;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)
             ((long)&meta._M_t.
                     super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
                     .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl + 7));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_48,(uchar *)data,
             (uchar *)((long)data + size),
             (allocator_type *)
             ((long)&meta._M_t.
                     super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
                     .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl + 7));
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&meta._M_t.
                     super___uniq_ptr_impl<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::CodeMetadataExpr_*,_std::default_delete<wabt::CodeMetadataExpr>_>
                     .super__Head_base<0UL,_wabt::CodeMetadataExpr_*,_false>._M_head_impl + 7));
  std::
  make_unique<wabt::CodeMetadataExpr,std::basic_string_view<char,std::char_traits<char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_string_view<char,_std::char_traits<char>_> *)local_58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->current_metadata_name_)
  ;
  pCVar1 = std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>::
           operator->((unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>
                       *)local_58);
  (pCVar1->super_ExprMixin<(wabt::ExprType)15>).super_Expr.loc.field_1.field_1.offset = offset;
  std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>::unique_ptr
            (&local_60,
             (unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> *)
             local_58);
  CodeMetadataExprQueue::push_metadata(&this->code_metadata_queue_,&local_60);
  std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>::~unique_ptr
            (&local_60);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>::~unique_ptr
            ((unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> *)
             local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnCodeMetadata(Offset offset,
                                      const void* data,
                                      Address size) {
  std::vector<uint8_t> data_(static_cast<const uint8_t*>(data),
                             static_cast<const uint8_t*>(data) + size);
  auto meta = std::make_unique<CodeMetadataExpr>(current_metadata_name_,
                                                 std::move(data_));
  meta->loc.offset = offset;
  code_metadata_queue_.push_metadata(std::move(meta));
  return Result::Ok;
}